

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

int __thiscall
ON_UuidPairList::GetId1s(ON_UuidPairList *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = uuid_list->m_count;
  ON_SimpleArray<ON_UUID_struct>::Reserve
            (uuid_list,
             (ulong)(((this->super_ON_SimpleArray<ON_UuidPair>).m_count + iVar1) -
                    this->m_removed_count));
  lVar3 = 0;
  lVar4 = 0;
  do {
    if ((this->super_ON_SimpleArray<ON_UuidPair>).m_count <= lVar4) {
      return uuid_list->m_count - iVar1;
    }
    bVar2 = ::operator==(&ON_max_uuid,
                         (ON_UUID_struct *)
                         (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 +
                         lVar3 + -8));
    if (bVar2) {
      bVar2 = ::operator==(&ON_max_uuid,
                           (ON_UUID_struct *)
                           (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[1].Data4 +
                           lVar3 + -8));
      if (!bVar2) goto LAB_003e958d;
    }
    else {
LAB_003e958d:
      ON_SimpleArray<ON_UUID_struct>::Append
                (uuid_list,
                 (ON_UUID_struct *)
                 (((this->super_ON_SimpleArray<ON_UuidPair>).m_a)->m_uuid[0].Data4 + lVar3 + -8));
    }
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

int ON_UuidPairList::GetId1s(
    ON_SimpleArray<ON_UUID>& uuid_list
    ) const
{
  const int count0 = uuid_list.Count();
  int i;
  uuid_list.Reserve(uuid_list.Count() + m_count - m_removed_count);
  for ( i = 0; i < m_count; i++ )
  {
    if ( ON_max_uuid == m_a[i].m_uuid[0] && ON_max_uuid == m_a[i].m_uuid[1] )
      continue;
    uuid_list.Append(m_a[i].m_uuid[0]);
  }
  return uuid_list.Count() - count0;
}